

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::resume(QXmlStreamReaderPrivate *this,int rule)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->resumeReduction = rule;
  if (this->error == NoError) {
    local_28.d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_28.size = 0;
    raiseError(this,PrematureEndOfDocumentError,(QString *)&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resume(int rule) {
    resumeReduction = rule;
    if (error == QXmlStreamReader::NoError)
        raiseError(QXmlStreamReader::PrematureEndOfDocumentError);
}